

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::cleanUpPowersOfOne(string *unit_string)

{
  bool bVar1;
  string *psVar2;
  reference pvVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  value_type ch;
  size_t eraseCnt;
  size_type fndP;
  size_type in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  value_type in_stack_ffffffffffffffe7;
  size_t in_stack_ffffffffffffffe8;
  size_type in_stack_fffffffffffffff0;
  
  for (psVar2 = (string *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(unaff_retaddr,(char *)in_RDI,in_stack_fffffffffffffff0);
      psVar2 != (string *)0xffffffffffffffff;
      psVar2 = (string *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (unaff_retaddr,(char *)in_RDI,(size_type)psVar2)) {
    in_stack_ffffffffffffffe8 = 4;
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe7 = *pvVar3;
    if ((in_stack_ffffffffffffffe7 == '+') || (in_stack_ffffffffffffffe7 == '-')) {
      in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(in_RDI);
      if (sVar4 <= (long)&(psVar2->_M_dataplus)._M_p + in_stack_ffffffffffffffe8) {
        multiplyRep(psVar2,in_stack_ffffffffffffffe8,
                    CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
        break;
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe7 = *pvVar3;
    }
    while (bVar1 = isDigitCharacter(in_stack_ffffffffffffffe7), bVar1) {
      in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 + 1;
      sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(in_RDI);
      if (sVar4 <= (long)&(psVar2->_M_dataplus)._M_p + in_stack_ffffffffffffffe8) break;
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe7 = *pvVar3;
    }
    multiplyRep(psVar2,in_stack_ffffffffffffffe8,
                CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                   (unaff_retaddr,(char *)in_RDI,(size_type)psVar2);
  do {
    while( true ) {
      if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  0xffffffffffffffff) {
        for (psVar2 = (string *)
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (unaff_retaddr,(char *)in_RDI,0xffffffffffffffff);
            psVar2 != (string *)0xffffffffffffffff;
            psVar2 = (string *)
                     std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::find(unaff_retaddr,(char *)in_RDI,(size_type)psVar2)) {
          multiplyRep(psVar2,in_stack_ffffffffffffffe8,
                      CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
        }
        return;
      }
      puVar5 = (undefined1 *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::size(in_RDI);
      if ((undefined1 *)((long)&(this->_M_dataplus)._M_p + 2U) < puVar5) break;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (this,in_stack_ffffffffffffffe8,
                 CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
LAB_006ce274:
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       (unaff_retaddr,(char *)in_RDI,(size_type)this);
    }
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
    bVar1 = isDigitCharacter(*pvVar3);
    if (!bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (this,in_stack_ffffffffffffffe8,
                 CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      goto LAB_006ce274;
    }
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                     (unaff_retaddr,(char *)in_RDI,(size_type)this);
  } while( true );
}

Assistant:

static void cleanUpPowersOfOne(std::string& unit_string)
{  // get rid of (1)^ sequences
    auto fndP = unit_string.find("(1)^");
    while (fndP != std::string::npos) {
        // string cannot end in '^' from a previous check
        size_t eraseCnt = 4;
        auto ch = unit_string[fndP + 4];
        if (ch == '+' || ch == '-') {
            ++eraseCnt;
            if (unit_string.size() <= fndP + eraseCnt) {
                multiplyRep(unit_string, fndP, eraseCnt);
                break;
            }
            ch = unit_string[fndP + eraseCnt];
        }
        while (isDigitCharacter(ch)) {
            ++eraseCnt;
            if (unit_string.size() <= fndP + eraseCnt) {
                break;
            }
            ch = unit_string[fndP + eraseCnt];
        }
        multiplyRep(unit_string, fndP, eraseCnt);
        fndP = unit_string.find("(1)^", fndP);
    }
    // get rid of ^1 sequences
    fndP = unit_string.find("^1");
    while (fndP != std::string::npos) {
        if (unit_string.size() > fndP + 2) {
            if (!isDigitCharacter(unit_string[fndP + 2])) {
                unit_string.erase(fndP, 2);
            } else {
                fndP = unit_string.find("^1", fndP + 2);
                continue;
            }
        } else {
            unit_string.erase(fndP, 2);
        }
        fndP = unit_string.find("^1", fndP);
    }
    // get rid of ^1 sequences
    fndP = unit_string.find("^(1)");
    while (fndP != std::string::npos) {
        multiplyRep(unit_string, fndP, 4);
        fndP = unit_string.find("^(1)", fndP);
    }
}